

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filteredbrk.cpp
# Opt level: O3

int32_t __thiscall
icu_63::SimpleFilteredSentenceBreakIterator::internalNext
          (SimpleFilteredSentenceBreakIterator *this,int32_t n)

{
  uint in_EAX;
  EFBMatchResult EVar1;
  int32_t n_00;
  int64_t iVar2;
  UErrorCode status;
  undefined8 uStack_28;
  
  if (n == -1) {
    n_00 = -1;
  }
  else {
    n_00 = n;
    if ((this->fData->fBackwardsTrie).super_LocalPointerBase<icu_63::UCharsTrie>.ptr !=
        (UCharsTrie *)0x0) {
      uStack_28 = (ulong)in_EAX;
      resetState(this,(UErrorCode *)((long)&uStack_28 + 4));
      n_00 = -1;
      if (uStack_28._4_4_ < 1) {
        iVar2 = utext_nativeLength_63((this->fText).super_LocalPointerBase<UText>.ptr);
        n_00 = n;
        do {
          if (iVar2 == n_00) {
            return n_00;
          }
          EVar1 = breakExceptionAt(this,n_00);
          if (EVar1 == kNoExceptionHere) {
            return n_00;
          }
          n_00 = (*(((this->fDelegate).super_LocalPointerBase<icu_63::BreakIterator>.ptr)->
                   super_UObject)._vptr_UObject[0xd])();
        } while (n_00 != -1);
      }
    }
  }
  return n_00;
}

Assistant:

int32_t
SimpleFilteredSentenceBreakIterator::internalNext(int32_t n) {
  if(n == UBRK_DONE || // at end  or
    fData->fBackwardsTrie.isNull()) { // .. no backwards table loaded == no exceptions
      return n;
  }
  // OK, do we need to break here?
  UErrorCode status = U_ZERO_ERROR;
  // refresh text
  resetState(status);
  if(U_FAILURE(status)) return UBRK_DONE; // bail out
  int64_t utextLen = utext_nativeLength(fText.getAlias());

  //if(debug2) u_printf("str, native len=%d\n", utext_nativeLength(fText.getAlias()));
  while (n != UBRK_DONE && n != utextLen) { // outer loop runs once per underlying break (from fDelegate).
    SimpleFilteredSentenceBreakIterator::EFBMatchResult m = breakExceptionAt(n);

    switch(m) {
    case kExceptionHere:
      n = fDelegate->next(); // skip this one. Find the next lowerlevel break.
      continue;

    default:
    case kNoExceptionHere:
      return n;
    }    
  }
  return n;
}